

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::check_done
          (basic_json_parser<char,_std::allocator<char>_> *this)

{
  size_t line;
  int iVar1;
  error_category *peVar2;
  int iVar3;
  ser_error *this_00;
  undefined4 extraout_var;
  error_code ec_00;
  error_code ec;
  error_code local_38;
  
  local_38._M_value = 0;
  local_38._M_cat = (error_category *)std::_V2::system_category();
  check_done(this,&local_38);
  if (local_38._M_value == 0) {
    return;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  peVar2 = local_38._M_cat;
  iVar1 = local_38._M_value;
  line = this->line_;
  iVar3 = (*(this->super_ser_context)._vptr_ser_context[3])(this);
  ec_00._4_4_ = 0;
  ec_00._M_value = iVar1;
  ec_00._M_cat = peVar2;
  ser_error::ser_error(this_00,ec_00,line,CONCAT44(extraout_var,iVar3));
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void check_done()
    {
        std::error_code ec;
        check_done(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec,line_,column()));
        }
    }